

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

void __thiscall
testing::internal::
ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
::ReturnAction(ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
               *this,ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
                     *value)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *__p;
  
  __p = (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
        operator_new(0x28);
  *(undefined8 *)
   &(__p->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(__p->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8) = 0;
  *(_Manager_type *)
   ((long)&(__p->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) =
       (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(__p->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18) =
       *(_Invoker_type *)
        ((long)&(value->payload)._M_t.
                super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18);
  p_Var1 = *(_Manager_type *)
            ((long)&(value->payload)._M_t.
                    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)
             ((long)&(value->payload)._M_t.
                     super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                     super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                     super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                     super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8);
    *(undefined8 *)
     &(__p->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>.
      _M_t.super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
      super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
      super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> =
         *(undefined8 *)
          &(value->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>;
    *(undefined8 *)
     ((long)&(__p->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8) = uVar2;
    *(_Manager_type *)
     ((long)&(__p->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) = p_Var1;
    *(_Manager_type *)
     ((long)&(value->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) =
         (_Manager_type)0x0;
    *(_Invoker_type *)
     ((long)&(value->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18) =
         (_Invoker_type)0x0;
  }
  (__p->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl =
       (value->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>.
       _M_t.super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
       super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl;
  (value->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl = (SDL_Window_conflict *)0x0;
  (this->value_).
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>*>
            (&(this->value_).
              super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  return;
}

Assistant:

explicit ReturnAction(R value) : value_(new R(std::move(value))) {}